

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_parse
              (secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *input,size_t inputlen)

{
  secp256k1_fe *r;
  int iVar1;
  int iVar2;
  uint uVar3;
  secp256k1_ge *a;
  bool bVar4;
  secp256k1_ge Q;
  secp256k1_fe x;
  secp256k1_fe x_1;
  unsigned_long _zzq_result;
  secp256k1_gej sStack_220;
  secp256k1_pubkey *psStack_188;
  uchar *puStack_180;
  ulong uStack_178;
  code *pcStack_170;
  secp256k1_ge local_168;
  secp256k1_fe local_f8;
  undefined1 local_c0 [136];
  int local_38;
  undefined4 local_34;
  
  if (ctx == (secp256k1_context *)0x0) {
    pcStack_170 = (code *)0x1076f4;
    secp256k1_ec_pubkey_parse_cold_4();
  }
  else if (pubkey != (secp256k1_pubkey *)0x0) {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input == (uchar *)0x0) {
      pcStack_170 = (code *)0x107700;
      secp256k1_ec_pubkey_parse_cold_2();
      return 0;
    }
    iVar2 = 0;
    iVar1 = iVar2;
    if (inputlen == 0x41) {
      if ((*input < 8) && ((0xd0U >> (*input & 0x1f) & 1) != 0)) {
        pcStack_170 = (code *)0x107467;
        secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)(local_c0 + 0x30),input + 1);
        bVar4 = (local_c0._64_8_ & local_c0._72_8_ & local_c0._56_8_) != 0xfffffffffffff;
        if ((ulong)local_c0._48_8_ < 0xffffefffffc2f || (bVar4 || local_c0._80_8_ != 0xffffffffffff)
           ) {
          local_c0._88_4_ = 1;
          local_c0._92_4_ = 1;
          pcStack_170 = (code *)0x1074b7;
          secp256k1_fe_verify((secp256k1_fe *)(local_c0 + 0x30));
        }
        else {
          local_c0._88_4_ = -1;
        }
        iVar1 = 0;
        if ((ulong)local_c0._48_8_ < 0xffffefffffc2f || (bVar4 || local_c0._80_8_ != 0xffffffffffff)
           ) {
          pcStack_170 = (code *)0x1074d6;
          secp256k1_fe_impl_set_b32_mod((secp256k1_fe *)local_c0,input + 0x21);
          if ((ulong)local_c0._0_8_ < 0xffffefffffc2f ||
              ((local_c0._16_8_ & local_c0._24_8_ & local_c0._8_8_) != 0xfffffffffffff ||
              local_c0._32_8_ != 0xffffffffffff)) {
            local_c0._40_4_ = 1;
            local_c0._44_4_ = 1;
            pcStack_170 = (code *)0x10756e;
            secp256k1_fe_verify((secp256k1_fe *)local_c0);
            pcStack_170 = (code *)0x10758f;
            secp256k1_ge_set_xy(&local_168,(secp256k1_fe *)(local_c0 + 0x30),
                                (secp256k1_fe *)local_c0);
            if ((*input & 0xfe) == 6) {
              a = (secp256k1_ge *)local_c0;
              pcStack_170 = (code *)0x1075a8;
              secp256k1_fe_verify((secp256k1_fe *)a);
              if (local_c0._44_4_ == 0) {
                pcStack_170 = secp256k1_ge_is_in_correct_subgroup;
                secp256k1_ec_pubkey_parse_cold_1();
                pcStack_170 = (code *)0x0;
                uStack_178 = local_c0._0_8_;
                psStack_188 = pubkey;
                puStack_180 = input;
                secp256k1_ge_verify(a);
                secp256k1_gej_set_infinity(&sStack_220);
                uVar3 = 0x1f;
                do {
                  secp256k1_gej_double_var(&sStack_220,&sStack_220,(secp256k1_fe *)0x0);
                  if ((0xdU >> (uVar3 & 0x1f) & 1) != 0) {
                    secp256k1_gej_add_ge_var(&sStack_220,&sStack_220,a,(secp256k1_fe *)0x0);
                  }
                  bVar4 = uVar3 != 0;
                  uVar3 = uVar3 - 1;
                } while (bVar4);
                secp256k1_gej_verify(&sStack_220);
                return sStack_220.infinity;
              }
              if ((*input != '\a') == (bool)((byte)local_c0._0_8_ & 1)) goto LAB_0010763b;
            }
            pcStack_170 = (code *)0x1075cf;
            secp256k1_ge_verify(&local_168);
            iVar1 = 0;
            if (local_168.infinity == 0) {
              pcStack_170 = (code *)0x1075ea;
              secp256k1_fe_sqr(&local_f8,&local_168.y);
              r = (secp256k1_fe *)(local_c0 + 0x60);
              pcStack_170 = (code *)0x107600;
              secp256k1_fe_sqr(r,&local_168.x);
              pcStack_170 = (code *)0x10760e;
              secp256k1_fe_mul(r,r,&local_168.x);
              pcStack_170 = (code *)0x107616;
              secp256k1_fe_verify(r);
              local_c0._96_8_ = local_c0._96_8_ + 2;
              local_38 = local_38 + 1;
              local_34 = 0;
              pcStack_170 = (code *)0x10762e;
              secp256k1_fe_verify(r);
              pcStack_170 = (code *)0x107639;
              iVar1 = secp256k1_fe_equal(&local_f8,r);
            }
          }
          else {
            local_c0._40_4_ = -1;
          }
        }
      }
    }
    else {
      iVar1 = 0;
      if ((inputlen == 0x21) && (iVar1 = iVar2, (*input & 0xfe) == 2)) {
        pcStack_170 = (code *)0x1073b9;
        secp256k1_fe_impl_set_b32_mod(&local_f8,input + 1);
        bVar4 = (local_f8.n[2] & local_f8.n[3] & local_f8.n[1]) != 0xfffffffffffff;
        if (local_f8.n[0] < 0xffffefffffc2f || (bVar4 || local_f8.n[4] != 0xffffffffffff)) {
          local_f8.magnitude = 1;
          local_f8.normalized = 1;
          pcStack_170 = (code *)0x10752d;
          secp256k1_fe_verify(&local_f8);
        }
        else {
          local_f8.magnitude = -1;
        }
        iVar1 = 0;
        if (local_f8.n[0] < 0xffffefffffc2f || (bVar4 || local_f8.n[4] != 0xffffffffffff)) {
          pcStack_170 = (code *)0x10754e;
          iVar1 = secp256k1_ge_set_xo_var(&local_168,&local_f8,(uint)(*input == '\x03'));
        }
      }
    }
LAB_0010763b:
    if (iVar1 == 0) {
      return 0;
    }
    pcStack_170 = (code *)0x107651;
    iVar1 = secp256k1_ge_is_in_correct_subgroup(&local_168);
    if (iVar1 != 0) {
      pcStack_170 = (code *)0x107664;
      secp256k1_pubkey_save(pubkey,&local_168);
      return 1;
    }
    return 0;
  }
  pcStack_170 = (code *)0x1076f9;
  secp256k1_ec_pubkey_parse_cold_3();
  return 0;
}

Assistant:

int secp256k1_ec_pubkey_parse(const secp256k1_context* ctx, secp256k1_pubkey* pubkey, const unsigned char *input, size_t inputlen) {
    secp256k1_ge Q;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input != NULL);
    if (!secp256k1_eckey_pubkey_parse(&Q, input, inputlen)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&Q)) {
        return 0;
    }
    secp256k1_pubkey_save(pubkey, &Q);
    secp256k1_ge_clear(&Q);
    return 1;
}